

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O2

void __thiscall
cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE>::reserve
          (cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE> *this,int _Count)

{
  BT_QUANTIZED_BVH_NODE *pBVar1;
  
  if (this->m_capacity < _Count) {
    pBVar1 = (BT_QUANTIZED_BVH_NODE *)allocate(this,_Count);
    copy(this,(EVP_PKEY_CTX *)0x0,(EVP_PKEY_CTX *)(ulong)(uint)this->m_size);
    deallocate(this);
    this->m_ownsMemory = true;
    this->m_data = pBVar1;
    this->m_capacity = _Count;
  }
  return;
}

Assistant:

SIMD_FORCE_INLINE void reserve(int _Count)
	{  // determine new minimum length of allocated storage
		if (capacity() < _Count)
		{  // not enough room, reallocate
			T* s = (T*)allocate(_Count);

			copy(0, size(), s);

			destroy(0, size());

			deallocate();

			//PCK: added this line
			m_ownsMemory = true;

			m_data = s;

			m_capacity = _Count;
		}
	}